

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ulong uVar3;
  pointer pcVar4;
  bool bVar5;
  void *pvVar6;
  ostream *poVar7;
  size_type sVar8;
  Argument *pAVar9;
  char *pcVar10;
  string *in_R8;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  string_view name;
  string name_padding;
  stringstream name_stream;
  long *local_210;
  size_type local_208;
  long local_200 [2];
  string local_1f0;
  Argument *local_1d0;
  undefined8 local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
  pbVar1 = (argument->m_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  name._M_str = (pbVar1->_M_dataplus)._M_p;
  name._M_len = pbVar1->_M_string_length;
  bVar5 = Argument::is_positional(name,argument->m_prefix_chars);
  local_1d0 = argument;
  if (bVar5) {
    sVar8 = (argument->m_metavar)._M_string_length;
    if (sVar8 == 0) {
      pbVar1 = (argument->m_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_current =
           (argument->m_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_210 = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210," ","");
      details::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_1f0,(details *)pbVar1,_Var2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                 in_R8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
    }
    else {
LAB_001215f6:
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(argument->m_metavar)._M_dataplus._M_p,sVar8);
    }
  }
  else {
    pbVar1 = (argument->m_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current =
         (argument->m_names).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
    details::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_1f0,(details *)pbVar1,_Var2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,in_R8
              );
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    argument = local_1d0;
    if ((((local_1d0->m_metavar)._M_string_length != 0) &&
        ((local_1d0->m_num_args_range).m_min == 1)) && ((local_1d0->m_num_args_range).m_max == 1)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      sVar8 = (argument->m_metavar)._M_string_length;
      goto LAB_001215f6;
    }
  }
  local_1c8 = *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10);
  std::__cxx11::stringbuf::str();
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_1f0,local_208,' ');
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_210,local_208);
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  uVar3 = (local_1d0->m_help)._M_string_length;
  if (uVar3 == 0) {
LAB_001217b2:
    pAVar9 = local_1d0;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,(pAVar9->m_help)._M_dataplus._M_p,(pAVar9->m_help)._M_string_length);
  }
  else {
    local_1c0 = (local_1d0->m_help)._M_dataplus._M_p;
    bVar5 = true;
    uVar14 = 0;
    uVar11 = uVar3;
    do {
      pcVar4 = (local_1d0->m_help)._M_dataplus._M_p;
      pvVar6 = memchr(pcVar4 + uVar14,10,uVar11 - uVar14);
      if ((pvVar6 == (void *)0x0) || (lVar13 = (long)pvVar6 - (long)pcVar4, lVar13 == -1)) break;
      if (uVar3 < uVar14) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar14,uVar3);
      }
      uVar11 = (lVar13 - uVar14) + 1;
      if (uVar3 - uVar14 < uVar11) {
        uVar11 = uVar3 - uVar14;
      }
      pcVar10 = local_1c0 + uVar14;
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,uVar11);
        bVar5 = false;
      }
      else {
        *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = local_1c8;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,uVar11);
      }
      uVar14 = lVar13 + 1;
      uVar11 = (local_1d0->m_help)._M_string_length;
    } while (uVar14 < uVar11);
    pAVar9 = local_1d0;
    if (bVar5) goto LAB_001217b2;
    if (uVar3 < uVar14) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar14,uVar3);
    }
    uVar12 = uVar11 - uVar14;
    if (uVar3 - uVar14 < uVar11 - uVar14) {
      uVar12 = uVar3 - uVar14;
    }
    if (uVar12 != 0) {
      *(undefined8 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = local_1c8;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1c0 + uVar14,uVar12);
    }
  }
  if ((pAVar9->m_help)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
  }
  operator<<(stream,&pAVar9->m_num_args_range);
  if (((pAVar9->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) ||
     ((pAVar9->m_num_args_range).m_max == 0 && (pAVar9->m_num_args_range).m_min == 0)) {
    if ((pAVar9->field_0x140 & 4) == 0) goto LAB_001218de;
    lVar13 = 10;
    pcVar10 = "[required]";
    poVar7 = stream;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[default: ",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(pAVar9->m_default_value_repr)._M_dataplus._M_p,
                        (pAVar9->m_default_value_repr)._M_string_length);
    lVar13 = 1;
    pcVar10 = "]";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar13);
LAB_001218de:
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream name_stream;
    name_stream << "  "; // indent
    if (argument.is_positional(argument.m_names.front(),
                               argument.m_prefix_chars)) {
      if (!argument.m_metavar.empty()) {
        name_stream << argument.m_metavar;
      } else {
        name_stream << details::join(argument.m_names.begin(),
                                     argument.m_names.end(), " ");
      }
    } else {
      name_stream << details::join(argument.m_names.begin(),
                                   argument.m_names.end(), ", ");
      // If we have a metavar, and one narg - print the metavar
      if (!argument.m_metavar.empty() &&
          argument.m_num_args_range == NArgsRange{1, 1}) {
        name_stream << " " << argument.m_metavar;
      }
    }

    // align multiline help message
    auto stream_width = stream.width();
    auto name_padding = std::string(name_stream.str().size(), ' ');
    auto pos = std::string::size_type{};
    auto prev = std::string::size_type{};
    auto first_line = true;
    auto hspace = "  "; // minimal space between name and help message
    stream << name_stream.str();
    std::string_view help_view(argument.m_help);
    while ((pos = argument.m_help.find('\n', prev)) != std::string::npos) {
      auto line = help_view.substr(prev, pos - prev + 1);
      if (first_line) {
        stream << hspace << line;
        first_line = false;
      } else {
        stream.width(stream_width);
        stream << name_padding << hspace << line;
      }
      prev += pos - prev + 1;
    }
    if (first_line) {
      stream << hspace << argument.m_help;
    } else {
      auto leftover = help_view.substr(prev, argument.m_help.size() - prev);
      if (!leftover.empty()) {
        stream.width(stream_width);
        stream << name_padding << hspace << leftover;
      }
    }

    // print nargs spec
    if (!argument.m_help.empty()) {
      stream << " ";
    }
    stream << argument.m_num_args_range;

    if (argument.m_default_value.has_value() &&
        argument.m_num_args_range != NArgsRange{0, 0}) {
      stream << "[default: " << argument.m_default_value_repr << "]";
    } else if (argument.m_is_required) {
      stream << "[required]";
    }
    stream << "\n";
    return stream;
  }